

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::Transaction::AddTxIn
          (Transaction *this,Txid *txid,uint32_t index,uint32_t sequence,Script *unlocking_script)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  CfdException *this_00;
  TxIn local_198;
  undefined1 local_108 [8];
  TxIn txin;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  Script *local_28;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  Transaction *this_local;
  
  local_28 = unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  sVar3 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
  uVar2 = ::std::numeric_limits<unsigned_int>::max();
  if (sVar3 == uVar2) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x234;
    local_40.funcname = "AddTxIn";
    logger::warn<>(&local_40,"vin maximum.");
    txin.super_AbstractTxIn.script_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"txin maximum.",&local_61);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_60);
    txin.super_AbstractTxIn.script_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AbstractTransaction::AddTxIn
            (&this->super_AbstractTransaction,_sequence_local,unlocking_script_local._4_4_,
             (uint32_t)unlocking_script_local,local_28);
  TxIn::TxIn((TxIn *)local_108,_sequence_local,unlocking_script_local._4_4_,
             (uint32_t)unlocking_script_local);
  bVar1 = Script::IsEmpty(local_28);
  if (!bVar1) {
    TxIn::TxIn(&local_198,_sequence_local,unlocking_script_local._4_4_,
               (uint32_t)unlocking_script_local,local_28);
    TxIn::operator=((TxIn *)local_108,&local_198);
    TxIn::~TxIn(&local_198);
  }
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
            (&this->vin_,(value_type *)local_108);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,1);
  sVar3 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
  TxIn::~TxIn((TxIn *)local_108);
  return (int)sVar3 - 1;
}

Assistant:

uint32_t Transaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  AbstractTransaction::AddTxIn(txid, index, sequence, unlocking_script);
  TxIn txin(txid, index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = TxIn(txid, index, sequence, unlocking_script);
  }

  vin_.push_back(txin);

  CallbackStateChange(kStateChangeAddTxIn);
  return static_cast<uint32_t>(vin_.size() - 1);
}